

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O3

ostream * operator<<(ostream *out,
                    FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *map)

{
  pointer ppVar1;
  ostream *out_00;
  char *pcVar2;
  pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
  *v;
  pointer custom;
  long lVar3;
  bool bVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{ ",2);
  custom = (map->vec_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (map->vec_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (custom != ppVar1) {
    lVar3 = 0;
    do {
      bVar4 = lVar3 != 0;
      lVar3 = lVar3 + -1;
      pcVar2 = ", ";
      if (!bVar4) {
        pcVar2 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,(ulong)((uint)bVar4 * 2));
      std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
      out_00 = operator<<(out,(CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)custom);
      std::__ostream_insert<char,std::char_traits<char>>(out_00,"] -> ",5);
      operator<<(out_00,(CustomType<int> *)&(custom->second)._M_string_length);
      custom = (pointer)&(custom->second).field_2;
    } while (custom != ppVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const FlatMap<Key, Value, Compare>& map) {
    out << "{ ";
    size_t i = 0;
    for (const auto& v : map) {
        out << (i++ == 0 ? "" : ", ") << "[" << v.first << "] -> " << v.second;
    }
    return out << " }";
}